

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.c
# Opt level: O0

X509_NAME_ENTRY *
X509_NAME_ENTRY_create_by_OBJ(X509_NAME_ENTRY **ne,ASN1_OBJECT *obj,int type,uchar *bytes,int len)

{
  int iVar1;
  X509_NAME_ENTRY *ret;
  X509_NAME_ENTRY *local_38;
  X509_NAME_ENTRY *local_8;
  
  if ((ne == (X509_NAME_ENTRY **)0x0) || (*ne == (X509_NAME_ENTRY *)0x0)) {
    local_38 = X509_NAME_ENTRY_new();
    if (local_38 == (X509_NAME_ENTRY *)0x0) {
      return (X509_NAME_ENTRY *)0x0;
    }
  }
  else {
    local_38 = *ne;
  }
  iVar1 = X509_NAME_ENTRY_set_object(local_38,obj);
  if ((iVar1 == 0) || (iVar1 = X509_NAME_ENTRY_set_data(local_38,type,bytes,len), iVar1 == 0)) {
    if ((ne == (X509_NAME_ENTRY **)0x0) || (local_38 != *ne)) {
      X509_NAME_ENTRY_free(local_38);
    }
    local_8 = (X509_NAME_ENTRY *)0x0;
  }
  else {
    if ((ne != (X509_NAME_ENTRY **)0x0) && (*ne == (X509_NAME_ENTRY *)0x0)) {
      *ne = local_38;
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

X509_NAME_ENTRY *X509_NAME_ENTRY_create_by_OBJ(X509_NAME_ENTRY **ne,
                                               const ASN1_OBJECT *obj, int type,
                                               const unsigned char *bytes,
                                               int len)
{
    X509_NAME_ENTRY *ret;

    if ((ne == NULL) || (*ne == NULL)) {
        if ((ret = X509_NAME_ENTRY_new()) == NULL)
            return NULL;
    } else
        ret = *ne;

    if (!X509_NAME_ENTRY_set_object(ret, obj))
        goto err;
    if (!X509_NAME_ENTRY_set_data(ret, type, bytes, len))
        goto err;

    if ((ne != NULL) && (*ne == NULL))
        *ne = ret;
    return ret;
 err:
    if ((ne == NULL) || (ret != *ne))
        X509_NAME_ENTRY_free(ret);
    return NULL;
}